

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
dynet::Sum::forward_impl
          (Sum *this,vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,
          Tensor *fx)

{
  Device_CPU *dev;
  
  dev = (Device_CPU *)fx->device;
  if (dev == (Device_CPU *)0x0) {
    __assert_fail("fx.device",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0x78a,
                  "virtual void dynet::Sum::forward_impl(const std::vector<const Tensor *> &, Tensor &) const"
                 );
  }
  if ((dev->super_Device).type == CPU) {
    forward_dev_impl<dynet::Device_CPU>(this,dev,xs,fx);
    return;
  }
  abort();
}

Assistant:

void SumBatches::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() == 1);
  unsigned num_args = xs[0]->d.bd;
#if __CUDACC__
  TensorTools::Zero(fx);
  for (unsigned i = 0; i < num_args; ++i)
    CUBLAS_CHECK(cublasSaxpy(dev.cublas_handle, fx.d.size(), kSCALAR_ONE, xs[0]->v + i * xs[0]->d.batch_size(), 1, fx.v, 1));
#else
  auto res = *fx;
  const unsigned remainder = num_args % 4;
  switch (remainder) {
    case 0: res.setZero(); break;
    case 1: res = xs[0]->batch_matrix(0); break;
    case 2: res = xs[0]->batch_matrix(0) + xs[0]->batch_matrix(1); break;
    case 3: res = xs[0]->batch_matrix(0) + xs[0]->batch_matrix(1) + xs[0]->batch_matrix(2); break;
  }
  for (unsigned i = remainder; i < num_args; i += 4)
    res += xs[0]->batch_matrix(i) + xs[0]->batch_matrix(i+1) + xs[0]->batch_matrix(i+2) + xs[0]->batch_matrix(i+3);
#endif
}